

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void kratos::DependencyVisitor::get_var_deps
               (Var *var,
               unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
               *dep,unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                    *linked_dep)

{
  VarType VVar1;
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  *local_40;
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  **local_38;
  Expr **expr;
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  *local_20;
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  *linked_dep_local;
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  *dep_local;
  Var *var_local;
  
  local_20 = linked_dep;
  linked_dep_local =
       (unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
        *)dep;
  dep_local = (unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
               *)var;
  VVar1 = Var::type(var);
  switch(VVar1) {
  case Base:
  case PortIO:
    std::
    unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>
    ::emplace<kratos::Var*&>
              ((unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>
                *)linked_dep_local,(Var **)&dep_local);
    break;
  case Expression:
    local_40 = dep_local;
    local_38 = &local_40;
    get_var_deps((Var *)dep_local[0xb]._M_h._M_before_begin._M_nxt,
                 (unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
                  *)linked_dep_local,local_20);
    if ((*local_38)[0xb]._M_h._M_element_count != 0) {
      get_var_deps((Var *)(*local_38)[0xb]._M_h._M_element_count,
                   (unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
                    *)linked_dep_local,local_20);
    }
    break;
  case Slice:
  case BaseCasted:
    compute_linked_dep((VarSlice *)dep_local,local_20);
    std::
    unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>
    ::emplace<kratos::Var*&>
              ((unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>
                *)linked_dep_local,(Var **)&dep_local);
    break;
  default:
  }
  return;
}

Assistant:

void static get_var_deps(
        Var *var, std::unordered_set<const Var *> &dep,
        std::unordered_map<const Var *, std::unordered_map<uint32_t, Var *>> &linked_dep) {
        switch (var->type()) {
            case VarType::Base:
            case VarType::PortIO: {
                dep.emplace(var);
                break;
            }
            case VarType ::Expression: {
                auto const &expr = reinterpret_cast<Expr *>(var);
                get_var_deps(expr->left, dep, linked_dep);
                if (expr->right) {
                    get_var_deps(expr->right, dep, linked_dep);
                }
                break;
            }
            case VarType::BaseCasted:
            case VarType ::Slice: {
                // compute linked dependency
                compute_linked_dep(reinterpret_cast<VarSlice *>(var), linked_dep);
                dep.emplace(var);
                break;
            }
            default: {
                // do nothing
            }
        }
    }